

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

QPainterPath __thiscall QPainterPath::united(QPainterPath *this,QPainterPath *p)

{
  QPainterPathPrivate *pQVar1;
  QPainterPathPrivate *pQVar2;
  QPainterPath *in_RDX;
  QPainterPath *other;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (p->d_ptr).d.ptr;
  other = in_RDX;
  if (pQVar1 != (QPainterPathPrivate *)0x0) {
    if (((((pQVar1->elements).d.size != 1) || (((pQVar1->elements).d.ptr)->type != MoveToElement))
        && (pQVar2 = (in_RDX->d_ptr).d.ptr, pQVar2 != (QPainterPathPrivate *)0x0)) &&
       (((pQVar2->elements).d.size != 1 || (((pQVar2->elements).d.ptr)->type != MoveToElement)))) {
      local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPathClipper::QPathClipper((QPathClipper *)local_48,p,in_RDX);
      QPathClipper::clip((QPathClipper *)this,(Operation)local_48);
      ~QPainterPath((QPainterPath *)(local_48 + 8));
      ~QPainterPath((QPainterPath *)local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
               (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
      }
      goto LAB_003e985c;
    }
    if (((pQVar1 != (QPainterPathPrivate *)0x0) && (other = p, (pQVar1->elements).d.size == 1)) &&
       (other = in_RDX, ((pQVar1->elements).d.ptr)->type != MoveToElement)) {
      other = p;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QPainterPath(this,other);
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
  }
LAB_003e985c:
  __stack_chk_fail();
}

Assistant:

QPainterPath QPainterPath::united(const QPainterPath &p) const
{
    if (isEmpty() || p.isEmpty())
        return isEmpty() ? p : *this;
    QPathClipper clipper(*this, p);
    return clipper.clip(QPathClipper::BoolOr);
}